

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::BlockingSample::Deserialize(BlockingSample *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> __ptr;
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> _Var1;
  SampleType SVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  _func_int **pp_Var7;
  pointer pBVar8;
  SerializationException *this_00;
  string str;
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> local_50;
  undefined1 local_48 [32];
  
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"base_reservoir_sample");
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_50._M_head_impl = (BaseReservoirSampling *)0x0;
  }
  else {
    local_50._M_head_impl = (BaseReservoirSampling *)0x0;
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      BaseReservoirSampling::Deserialize((BaseReservoirSampling *)local_48,deserializer);
      local_50._M_head_impl = (BaseReservoirSampling *)local_48._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    SVar2 = EnumUtil::FromString<duckdb::SampleType>((char *)local_48._0_8_);
    uVar5 = (uint)SVar2;
    if ((BaseReservoirSampling *)local_48._0_8_ != (BaseReservoirSampling *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    uVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"destroyed");
  pp_Var7 = deserializer->_vptr_Deserializer;
  if ((char)uVar6 == '\0') {
    uVar3 = false;
  }
  else {
    iVar4 = (*pp_Var7[0xc])(deserializer);
    uVar3 = (undefined1)iVar4;
    pp_Var7 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var7[5])(deserializer,(ulong)(uVar6 & 0xff));
  if ((char)uVar5 == '\x01') {
    ReservoirSample::Deserialize((ReservoirSample *)local_48,deserializer);
  }
  else {
    if ((uVar5 & 0xff) != 2) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_48._0_8_ = local_48 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Unsupported type for deserialization of BlockingSample!","");
      SerializationException::SerializationException(this_00,(string *)local_48);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ReservoirSamplePercentage::Deserialize((ReservoirSamplePercentage *)local_48,deserializer);
  }
  this->_vptr_BlockingSample = (_func_int **)local_48._0_8_;
  pBVar8 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  _Var1._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (BaseReservoirSampling *)0x0;
  __ptr._M_head_impl =
       (pBVar8->base_reservoir_sample).
       super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
       .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl;
  (pBVar8->base_reservoir_sample).
  super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
  .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (__ptr._M_head_impl != (BaseReservoirSampling *)0x0) {
    ::std::default_delete<duckdb::BaseReservoirSampling>::operator()
              ((default_delete<duckdb::BaseReservoirSampling> *)&pBVar8->base_reservoir_sample,
               __ptr._M_head_impl);
  }
  pBVar8 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  pBVar8->destroyed = (bool)uVar3;
  if (local_50._M_head_impl != (BaseReservoirSampling *)0x0) {
    ::std::default_delete<duckdb::BaseReservoirSampling>::operator()
              ((default_delete<duckdb::BaseReservoirSampling> *)&local_50,local_50._M_head_impl);
  }
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> BlockingSample::Deserialize(Deserializer &deserializer) {
	auto base_reservoir_sample = deserializer.ReadPropertyWithDefault<unique_ptr<BaseReservoirSampling>>(100, "base_reservoir_sample");
	auto type = deserializer.ReadProperty<SampleType>(101, "type");
	auto destroyed = deserializer.ReadPropertyWithDefault<bool>(102, "destroyed");
	unique_ptr<BlockingSample> result;
	switch (type) {
	case SampleType::RESERVOIR_PERCENTAGE_SAMPLE:
		result = ReservoirSamplePercentage::Deserialize(deserializer);
		break;
	case SampleType::RESERVOIR_SAMPLE:
		result = ReservoirSample::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of BlockingSample!");
	}
	result->base_reservoir_sample = std::move(base_reservoir_sample);
	result->destroyed = destroyed;
	return result;
}